

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IGUIElement.h
# Opt level: O2

void __thiscall irr::gui::IGUIElement::setTabOrder(IGUIElement *this,s32 index)

{
  IGUIElement *pIVar1;
  IGUIElement *this_00;
  IGUIElement *closest;
  IGUIElement *first;
  
  if (index < 0) {
    this->TabOrder = 0;
    pIVar1 = getTabGroup(this);
    do {
      this_00 = pIVar1;
      if ((this_00 == (IGUIElement *)0x0) || (this->IsTabGroup == false)) {
        if (this_00 == (IGUIElement *)0x0) {
          return;
        }
        break;
      }
      pIVar1 = this_00->Parent;
    } while (this_00->Parent != (IGUIElement *)0x0);
    first = (IGUIElement *)0x0;
    closest = (IGUIElement *)0x0;
    getNextElement(this_00,-1,true,this->IsTabGroup,&first,&closest,true,true);
    if (first != (IGUIElement *)0x0) {
      this->TabOrder = first->TabOrder + 1;
    }
  }
  else {
    this->TabOrder = index;
  }
  return;
}

Assistant:

void setTabOrder(s32 index)
	{
		// negative = autonumber
		if (index < 0) {
			TabOrder = 0;
			IGUIElement *el = getTabGroup();
			while (IsTabGroup && el && el->Parent)
				el = el->Parent;

			IGUIElement *first = 0, *closest = 0;
			if (el) {
				// find the highest element number
				el->getNextElement(-1, true, IsTabGroup, first, closest, true, true);
				if (first) {
					TabOrder = first->getTabOrder() + 1;
				}
			}

		} else
			TabOrder = index;
	}